

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

void libxml_xmlTextReaderErrorCallback
               (void *arg,char *msg,int severity,xmlTextReaderLocatorPtr locator)

{
  long lVar1;
  long *plVar2;
  PyObject *pPVar3;
  long *plVar4;
  
  plVar2 = (long *)PyTuple_New(4);
  PyTuple_SetItem(plVar2,0,*(undefined8 *)((long)arg + 8));
  plVar4 = *(long **)((long)arg + 8);
  if (plVar4 != (long *)0x0) {
    *plVar4 = *plVar4 + 1;
  }
  pPVar3 = libxml_charPtrConstWrap(msg);
  PyTuple_SetItem(plVar2,1,pPVar3);
  pPVar3 = libxml_intWrap(severity);
  PyTuple_SetItem(plVar2,2,pPVar3);
  pPVar3 = libxml_xmlTextReaderLocatorPtrWrap(locator);
  PyTuple_SetItem(plVar2,3,pPVar3);
  plVar4 = (long *)PyEval_CallObjectWithKeywords(*arg,plVar2,0);
  if (plVar4 == (long *)0x0) {
    PyErr_Print();
    if (plVar2 == (long *)0x0) {
      return;
    }
    *plVar2 = *plVar2 + -1;
    lVar1 = *plVar2;
    plVar4 = plVar2;
  }
  else {
    if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
      _Py_Dealloc(plVar2);
    }
    *plVar4 = *plVar4 + -1;
    lVar1 = *plVar4;
  }
  if (lVar1 != 0) {
    return;
  }
  _Py_Dealloc(plVar4);
  return;
}

Assistant:

static void 
libxml_xmlTextReaderErrorCallback(void *arg, 
				  const char *msg,
				  int severity,
				  xmlTextReaderLocatorPtr locator)
{
    xmlTextReaderPyCtxt *pyCtxt = (xmlTextReaderPyCtxt *)arg;
    PyObject *list;
    PyObject *result;
    
    list = PyTuple_New(4);
    PyTuple_SetItem(list, 0, pyCtxt->arg);
    Py_XINCREF(pyCtxt->arg);
    PyTuple_SetItem(list, 1, libxml_charPtrConstWrap(msg));
    PyTuple_SetItem(list, 2, libxml_intWrap(severity));
    PyTuple_SetItem(list, 3, libxml_xmlTextReaderLocatorPtrWrap(locator));
    result = PyEval_CallObject(pyCtxt->f, list);
    if (result == NULL)
    {
	/* TODO: manage for the exception to be propagated... */
	PyErr_Print();
    }
    Py_XDECREF(list);
    Py_XDECREF(result);
}